

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

attribute_t choose_game_window_attributes(tgestate_t *state)

{
  attribute_t aVar1;
  
  if (state->room_index < 0x1d) {
    if (state->day_or_night == '\0') {
      aVar1 = '\a';
    }
    else {
      aVar1 = '\x05';
      if (state->room_index == 0) {
        aVar1 = 'A';
      }
    }
  }
  else {
    aVar1 = '\x02';
    if ((state->items_held[0] != '\x04') && (state->items_held[1] != '\x04')) {
      memset(state->tile_buf,0,state->tile_buf_size);
      plot_interior_tiles(state);
      aVar1 = '\x01';
    }
  }
  state->game_window_attribute = aVar1;
  return aVar1;
}

Assistant:

attribute_t choose_game_window_attributes(tgestate_t *state)
{
  attribute_t attr;

  assert(state != NULL);

  if (state->room_index < room_29_SECOND_TUNNEL_START)
  {
    /* The hero is outside, or in a room, but not in a tunnel. */

    if (state->day_or_night == 0) /* Outside or room, daytime. */
      attr = attribute_WHITE_OVER_BLACK;
    else if (state->room_index == room_0_OUTDOORS) /* Outside, nighttime. */
      attr = attribute_BRIGHT_BLUE_OVER_BLACK;
    else /* Room, nighttime. */
      attr = attribute_CYAN_OVER_BLACK;
  }
  else
  {
    /* The hero is in a tunnel. */

    if (state->items_held[0] == item_TORCH ||
        state->items_held[1] == item_TORCH)
    {
      /* The hero holds a torch - draw the room. */

      attr = attribute_RED_OVER_BLACK;
    }
    else
    {
      /* The hero holds no torch - draw nothing. */

      wipe_visible_tiles(state);
      plot_interior_tiles(state);
      attr = attribute_BLUE_OVER_BLACK;
    }
  }

  state->game_window_attribute = attr;

  return attr;
}